

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeResumeThrow
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,HeapType type,Name tag,
          vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
          *resumetable)

{
  pointer pOVar1;
  OnClauseInfo *info;
  pointer __x;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_c0;
  undefined1 auStack_98 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> tags;
  undefined1 auStack_68 [8];
  vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> labels;
  _Storage<unsigned_int,_true> local_3c;
  undefined1 local_38;
  Index local_34;
  
  auStack_98 = (undefined1  [8])0x0;
  tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  labels.
  super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  labels.
  super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_34 = pos;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::reserve
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_98,
             ((long)(resumetable->
                    super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(resumetable->
                   super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::reserve
            ((vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             auStack_68,
             ((long)(resumetable->
                    super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(resumetable->
                   super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pOVar1 = (resumetable->
           super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (resumetable->
             super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != pOVar1; __x = __x + 1) {
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_98,&__x->tag);
    if (__x->isOnSwitch == true) {
      local_38 = 0;
      std::vector<std::optional<unsigned_int>,std::allocator<std::optional<unsigned_int>>>::
      emplace_back<std::optional<unsigned_int>>
                ((vector<std::optional<unsigned_int>,std::allocator<std::optional<unsigned_int>>> *)
                 auStack_68,(optional<unsigned_int> *)&local_3c);
    }
    else {
      local_3c = (_Storage<unsigned_int,_true>)__x->label;
      local_38 = 1;
      std::vector<std::optional<unsigned_int>,std::allocator<std::optional<unsigned_int>>>::
      emplace_back<std::optional<unsigned_int>>
                ((vector<std::optional<unsigned_int>,std::allocator<std::optional<unsigned_int>>> *)
                 auStack_68,(optional<unsigned_int> *)&local_3c);
    }
  }
  IRBuilder::makeResumeThrow
            ((Result<wasm::Ok> *)&local_c0,&this->irBuilder,type,tag,
             (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_98,
             (vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             auStack_68);
  withLoc<wasm::Ok>(__return_storage_ptr__,this,local_34,(Result<wasm::Ok> *)&local_c0);
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            (&local_c0);
  std::_Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::
  ~_Vector_base((_Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                 *)auStack_68);
  std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
            ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_98);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeResumeThrow(Index pos,
                           const std::vector<Annotation>& annotations,
                           HeapType type,
                           Name tag,
                           const std::vector<OnClauseInfo>& resumetable) {
    std::vector<Name> tags;
    std::vector<std::optional<Index>> labels;
    tags.reserve(resumetable.size());
    labels.reserve(resumetable.size());
    for (const OnClauseInfo& info : resumetable) {
      tags.push_back(info.tag);
      if (info.isOnSwitch) {
        labels.push_back(std::nullopt);
      } else {
        labels.push_back(std::optional<Index>(info.label));
      }
    }
    return withLoc(pos, irBuilder.makeResumeThrow(type, tag, tags, labels));
  }